

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_ls.c
# Opt level: O3

int CVodeSetJacTimesBS(void *cvode_mem,int which,CVLsJacTimesSetupFnBS jtsetupBS,
                      CVLsJacTimesVecFnBS jtimesBS)

{
  int iVar1;
  code *jtimes;
  code *jtsetup;
  CVLsMemB cvlsB_mem;
  CVodeBMem cvB_mem;
  CVadjMem ca_mem;
  CVodeMem cv_mem;
  CVLsMemB local_30;
  CVodeBMem local_28;
  CVadjMem local_20;
  CVodeMem local_18;
  
  iVar1 = cvLs_AccessLMemB(cvode_mem,which,"CVodeSetJacTimesBS",&local_18,&local_20,&local_28,
                           &local_30);
  if (iVar1 != 0) {
    return iVar1;
  }
  local_30->jtsetupBS = jtsetupBS;
  local_30->jtimesBS = jtimesBS;
  jtsetup = cvLsJacTimesSetupBSWrapper;
  if (jtsetupBS == (CVLsJacTimesSetupFnBS)0x0) {
    jtsetup = (CVLsJacTimesSetupFn)0x0;
  }
  jtimes = cvLsJacTimesVecBSWrapper;
  if (jtimesBS == (CVLsJacTimesVecFnBS)0x0) {
    jtimes = (CVLsJacTimesVecFn)0x0;
  }
  iVar1 = CVodeSetJacTimes(local_28->cv_mem,jtsetup,jtimes);
  return iVar1;
}

Assistant:

int CVodeSetJacTimesBS(void* cvode_mem, int which,
                       CVLsJacTimesSetupFnBS jtsetupBS,
                       CVLsJacTimesVecFnBS jtimesBS)
{
  CVodeMem cv_mem;
  CVadjMem ca_mem;
  CVodeBMem cvB_mem;
  void* cvodeB_mem;
  CVLsMemB cvlsB_mem;
  CVLsJacTimesSetupFn cvls_jtsetup;
  CVLsJacTimesVecFn cvls_jtimes;
  int retval;

  /* access relevant memory structures */
  retval = cvLs_AccessLMemB(cvode_mem, which, __func__, &cv_mem, &ca_mem,
                            &cvB_mem, &cvlsB_mem);
  if (retval != CVLS_SUCCESS) { return (retval); }

  /* Set jacobian routines for the backward problem. */
  cvlsB_mem->jtsetupBS = jtsetupBS;
  cvlsB_mem->jtimesBS  = jtimesBS;

  /* Call the corresponding "set" routine for the backward problem */
  cvodeB_mem   = (void*)(cvB_mem->cv_mem);
  cvls_jtsetup = (jtsetupBS == NULL) ? NULL : cvLsJacTimesSetupBSWrapper;
  cvls_jtimes  = (jtimesBS == NULL) ? NULL : cvLsJacTimesVecBSWrapper;
  return (CVodeSetJacTimes(cvodeB_mem, cvls_jtsetup, cvls_jtimes));
}